

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::GetRayTracingShaderGroupHandles
          (VulkanLogicalDevice *this,VkPipeline pipeline,uint32_t firstGroup,uint32_t groupCount,
          size_t dataSize,void *pData)

{
  VkResult VVar1;
  
  VVar1 = (*vkGetRayTracingShaderGroupHandlesKHR)
                    (this->m_VkDevice,pipeline,firstGroup,groupCount,dataSize,pData);
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::GetRayTracingShaderGroupHandles(VkPipeline pipeline, uint32_t firstGroup, uint32_t groupCount, size_t dataSize, void* pData) const
{
#if DILIGENT_USE_VOLK
    return vkGetRayTracingShaderGroupHandlesKHR(m_VkDevice, pipeline, firstGroup, groupCount, dataSize, pData);
#else
    UNSUPPORTED("vkGetRayTracingShaderGroupHandlesKHR is only available through Volk");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}